

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O0

void __thiscall rtosc::UndoHistory::recordEvent(UndoHistory *this,char *msg)

{
  bool bVar1;
  size_type sVar2;
  size_t __n;
  void *__dest;
  reference pvVar3;
  void *in_RSI;
  long *in_RDI;
  time_t now;
  char *data;
  size_t len;
  UndoHistoryImpl *in_stack_00000068;
  value_type *in_stack_ffffffffffffff98;
  deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
  *in_stack_ffffffffffffffa0;
  deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_> *this_00;
  pair<long,_char_*> in_stack_ffffffffffffffb8;
  size_type in_stack_ffffffffffffffc8;
  deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
  *in_stack_ffffffffffffffd0;
  
  sVar2 = std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
          ::size((deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                  *)0x1243b0);
  if (sVar2 != (*(ulong *)(*in_RDI + 0x50) & 0xffffffff)) {
    std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
    resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  __n = rtosc_message_length(in_stack_ffffffffffffffb8.second,in_stack_ffffffffffffffb8.first);
  __dest = operator_new__(__n);
  time((time_t *)0x0);
  bVar1 = UndoHistoryImpl::mergeEvent(in_stack_00000068,(time_t)this,msg,(char *)len,(size_t)data);
  if (!bVar1) {
    memcpy(__dest,in_RSI,__n);
    std::make_pair<long&,char*&>
              ((long *)in_stack_ffffffffffffffa0,(char **)in_stack_ffffffffffffff98);
    std::pair<long,_const_char_*>::pair<long,_char_*,_true>
              ((pair<long,_const_char_*> *)&stack0xffffffffffffffc8,
               (pair<long,_char_*> *)&stack0xffffffffffffffb8);
    std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
    push_back(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *(long *)(*in_RDI + 0x50) = *(long *)(*in_RDI + 0x50) + 1;
    sVar2 = std::
            deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
            size((deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                  *)0x1244aa);
    if (*(uint *)(*in_RDI + 0x58) < sVar2) {
      pvVar3 = std::
               deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ::operator[](in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
      this_00 = (deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 *)pvVar3->second;
      if (this_00 !=
          (deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_> *)
          0x0) {
        operator_delete__(this_00);
      }
      std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
      pop_front(this_00);
      *(long *)(*in_RDI + 0x50) = *(long *)(*in_RDI + 0x50) + -1;
    }
  }
  return;
}

Assistant:

void UndoHistory::recordEvent(const char *msg)
{
    //TODO Properly account for when you have traveled back in time.
    //while this could result in another branch of history, the simple method
    //would be to kill off any future redos when new history is recorded
    if(impl->history.size() != (unsigned) impl->history_pos) {
        impl->history.resize(impl->history_pos);
    }

    size_t len = rtosc_message_length(msg, -1);
    char *data = new char[len];
    time_t now = time(NULL);
    //printf("now = '%ld'\n", now);
    if(!impl->mergeEvent(now, msg, data, len)) {
        memcpy(data, msg, len);
        impl->history.push_back(make_pair(now, data));
        impl->history_pos++;
        if(impl->history.size() > impl->max_history_size)
        {
            delete[] impl->history[0].second;
            impl->history.pop_front();
            impl->history_pos--;
        }
    }

}